

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.h
# Opt level: O1

void __thiscall
bezier::BinomialCoefficients<4UL>::BinomialCoefficients(BinomialCoefficients<4UL> *this)

{
  long lVar1;
  ulong uVar2;
  unsigned_long *puVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  (this->mCoefficients)._M_elems[2] = 0;
  (this->mCoefficients)._M_elems[3] = 0;
  (this->mCoefficients)._M_elems[0] = 0;
  (this->mCoefficients)._M_elems[1] = 0;
  (this->mCoefficients)._M_elems[4] = 0;
  lVar4 = 0;
  do {
    if (lVar4 == 0) {
      uVar2 = 1;
    }
    else {
      uVar5 = 1;
      lVar6 = 4;
      uVar2 = 1;
      do {
        uVar2 = (uVar2 * lVar6) / uVar5;
        uVar5 = uVar5 + 1;
        lVar1 = lVar4 + lVar6;
        lVar6 = lVar6 + -1;
      } while (lVar1 != 5);
    }
    (this->mCoefficients)._M_elems[lVar4] = uVar2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  puVar3 = (this->mCoefficients)._M_elems + 1;
  lVar4 = 0;
  do {
    (this->mCoefficients)._M_elems[lVar4 + 3] = *puVar3;
    lVar4 = lVar4 + 1;
    puVar3 = puVar3 + -1;
  } while (lVar4 != 2);
  return;
}

Assistant:

BinomialCoefficients()
        {
            size_t center = N / 2;
            size_t k = 0;

            while (k <= center)
            {
                mCoefficients[k] = internal::binomial(N, k);
                k++;
            }

            // Utilize the symmetrical nature of the binomial coefficients.
            while (k <= N)
            {
                mCoefficients[k] = mCoefficients[N - k];
                k++;
            }
        }